

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

void __thiscall amrex::CoordSys::HiFace(CoordSys *this,IntVect *point,int dir,Real *loc)

{
  long in_RCX;
  int in_EDX;
  long in_RSI;
  literals *in_RDI;
  literals *this_00;
  Real RVar1;
  Real off;
  int k;
  double local_68;
  int local_34;
  
  this_00 = in_RDI;
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    local_68 = literals::operator____rt(this_00,(longdouble)1);
    RVar1 = literals::operator____rt(this_00,(longdouble)0.5);
    if (local_34 != in_EDX) {
      local_68 = RVar1;
    }
    *(double *)(in_RCX + (long)local_34 * 8) =
         *(double *)(in_RDI + (long)local_34 * 8 + 0x20) *
         (local_68 + (double)*(int *)(in_RSI + (long)local_34 * 4)) +
         *(double *)(in_RDI + (long)local_34 * 8 + 8);
  }
  return;
}

Assistant:

void
CoordSys::HiFace (const IntVect& point,
                  int            dir,
                  Real*          loc) const noexcept
{
    AMREX_ASSERT(ok);
    AMREX_ASSERT(loc != 0);
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        Real off = (k == dir) ? 1.0_rt : 0.5_rt;
        loc[k] = offset[k] + dx[k]*(off + (Real)point[k]);
    }
}